

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteDouble(Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,double d)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *in_RDI;
  double in_XMM0_Qa;
  char *p;
  char *end;
  char buffer [25];
  Ch in_stack_ffffffffffffff9f;
  undefined8 in_stack_ffffffffffffffa8;
  int maxDecimalPlaces;
  char *in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  Double local_20 [3];
  bool local_1;
  
  maxDecimalPlaces = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  internal::Double::Double(local_20,in_XMM0_Qa);
  bVar1 = internal::Double::IsNanOrInf(local_20);
  if (bVar1) {
    local_1 = false;
  }
  else {
    pcVar2 = internal::dtoa(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,maxDecimalPlaces);
    PutReserve<rapidjson::BasicOStreamWrapper<std::ostream>>
              ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)
               in_RDI->stream_,(long)pcVar2 - (long)&stack0xffffffffffffffb8);
    for (pcVar3 = &stack0xffffffffffffffb8; pcVar3 != pcVar2; pcVar3 = pcVar3 + 1) {
      PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>(in_RDI,in_stack_ffffffffffffff9f);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool WriteDouble(double d) {
        if (internal::Double(d).IsNanOrInf()) {
            if (!(writeFlags & kWriteNanAndInfFlag) && !(writeFlags & kWriteNanAndInfNullFlag))
                return false;
            if (writeFlags & kWriteNanAndInfNullFlag) {
                PutReserve(*os_, 4);
                PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 'l');
                return true;
            }
            if (internal::Double(d).IsNan()) {
                PutReserve(*os_, 3);
                PutUnsafe(*os_, 'N'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'N');
                return true;
            }
            if (internal::Double(d).Sign()) {
                PutReserve(*os_, 9);
                PutUnsafe(*os_, '-');
            }
            else
                PutReserve(*os_, 8);
            PutUnsafe(*os_, 'I'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'f');
            PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'y');
            return true;
        }

        char buffer[25];
        char* end = internal::dtoa(d, buffer, maxDecimalPlaces_);
        PutReserve(*os_, static_cast<size_t>(end - buffer));
        for (char* p = buffer; p != end; ++p)
            PutUnsafe(*os_, static_cast<typename OutputStream::Ch>(*p));
        return true;
    }